

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasks.c
# Opt level: O3

void InitTask(void)

{
  char *pcVar1;
  int iVar2;
  char *__format;
  
  signal(2,ProgStop);
  CreateLogFile();
  iVar2 = setProgPri(100);
  if (iVar2 != 0) {
    printf("[WARNING]:");
    puts("Set priority unsuccessfully.");
    putchar(10);
  }
  if (DevType == RPI) {
    __format = "Open /dev/ttyAMA0";
    pcVar1 = "Open /dev/ttyAMA0";
  }
  else {
    if (DevType != PC) goto LAB_00103ce0;
    __format = "Open /dev/ttyUSB0";
    pcVar1 = "Open /dev/ttyUSB0";
  }
  fd_serialport = serialOpen(pcVar1 + 5,0x1c200);
  printf("[TIPS]:");
  printf(__format);
  putchar(10);
LAB_00103ce0:
  if (fd_serialport < 0) {
    printf("[WARNING]:");
    printf("SerialPort failed to initialize. -err:%d",(ulong)(uint)fd_serialport);
    putchar(10);
    printf("[TIPS]:");
    printf("Please check whether there is a serial device plugged in.");
    putchar(10);
    printf("[TIPS]:");
    printf("Press ENTER to continue without connection.");
    putchar(10);
    getchar();
  }
  else {
    printf("[TIPS]:");
    printf("SerialPort initialized successfully. fd:%d",(ulong)(uint)fd_serialport);
    putchar(10);
  }
  Init_AllPara(2);
  SCurveCtrl_Init();
  PID_Init();
  Calc_Position2Zero();
  Calc_Body2Leg();
  Modify_Posture();
  if (sRobot_MotionPara.Gait != 2) {
    if (sRobot_MotionPara.Gait == 1) {
      Calc_GaitTrajPolyCoeffi_Trot();
      return;
    }
    return;
  }
  Calc_GaitTrajPolyCoeffi_Walk();
  return;
}

Assistant:

void InitTask(void)
{
	signal(SIGINT, ProgStop);
	CreateLogFile();

	if (setProgPri(100) != 0)
		PRINTF_WARNING("Set priority unsuccessfully.\n");

	switch (DevType)
	{
	case RPI:
		fd_serialport = serialOpen("/dev/ttyAMA0", 115200);
		PRINTF_TIPS("Open /dev/ttyAMA0");
		break;
	case PC:
		fd_serialport = serialOpen("/dev/ttyUSB0", 115200);
		PRINTF_TIPS("Open /dev/ttyUSB0");
		break;
	}
	if (fd_serialport < 0)
	{
		PRINTF_WARNING("SerialPort failed to initialize. -err:%d", fd_serialport);
		PRINTF_TIPS("Please check whether there is a serial device plugged in.");
		PRINTF_TIPS("Press ENTER to continue without connection.");
		getchar();
	}
	else
	{
		PRINTF_TIPS("SerialPort initialized successfully. fd:%d", fd_serialport);
	}

	//serialTest(fd_serialport, FRAME_HEAD);

	Init_AllPara(GAIT_WALK);
	SCurveCtrl_Init();
	PID_Init();
	Calc_Position2Zero();
	Calc_Body2Leg();
	Modify_Posture();
	switch (sRobot_MotionPara.Gait)
	{
	case 1:
		Calc_GaitTrajPolyCoeffi_Trot();
		break;
	case 2:
		Calc_GaitTrajPolyCoeffi_Walk();
		break;
	}
}